

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O0

void Fxu_ListMatrixDelSingle(Fxu_Matrix *p,Fxu_Single *pLink)

{
  Fxu_ListSingle *pList;
  Fxu_Single *pLink_local;
  Fxu_Matrix *p_local;
  
  if ((p->lSingles).pHead == pLink) {
    (p->lSingles).pHead = pLink->pNext;
  }
  if ((p->lSingles).pTail == pLink) {
    (p->lSingles).pTail = pLink->pPrev;
  }
  if (pLink->pPrev != (Fxu_Single *)0x0) {
    pLink->pPrev->pNext = pLink->pNext;
  }
  if (pLink->pNext != (Fxu_Single *)0x0) {
    pLink->pNext->pPrev = pLink->pPrev;
  }
  (p->lSingles).nItems = (p->lSingles).nItems + -1;
  return;
}

Assistant:

void Fxu_ListMatrixDelSingle( Fxu_Matrix * p, Fxu_Single * pLink )
{
	Fxu_ListSingle * pList = &p->lSingles;
	if ( pList->pHead == pLink )
		 pList->pHead = pLink->pNext;
	if ( pList->pTail == pLink )
		 pList->pTail = pLink->pPrev;
	if ( pLink->pPrev )
		 pLink->pPrev->pNext = pLink->pNext;
	if ( pLink->pNext )
		 pLink->pNext->pPrev = pLink->pPrev;
	pList->nItems--;
}